

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O3

int condvar_wait(worker_config_conflict *c,int *flag)

{
  uv_mutex_t *puVar1;
  int iVar2;
  undefined8 *puVar3;
  int64_t eval_b;
  int64_t eval_a;
  undefined8 local_28;
  
  puVar1 = &c->mutex;
  uv_mutex_lock(puVar1);
  uv_sem_post(c);
  do {
    uv_cond_wait(&c->cond,puVar1);
  } while (*flag == 0);
  local_28 = 1;
  if (*flag == 1) {
    uv_mutex_unlock(puVar1);
    uv_sem_wait(&c->sem_signaled);
    return 0;
  }
  puVar3 = &local_28;
  condvar_wait_cold_1();
  (*(code *)puVar3[0x15])();
  iVar2 = (*(code *)puVar3[0x16])(puVar3,puVar3 + 0x14);
  return iVar2;
}

Assistant:

static int condvar_wait(worker_config* c, const int* flag) {
  uv_mutex_lock(&c->mutex);

  /* Tell signal'er that I am waiting. */
  uv_sem_post(&c->sem_waiting);

  /* Wait until I get a non-spurious signal. */
  do {
    uv_cond_wait(&c->cond, &c->mutex);
  } while (*flag == 0);
  ASSERT_EQ(1, *flag);

  uv_mutex_unlock(&c->mutex);

  /* Wait for my signal'er to finish. */
  uv_sem_wait(&c->sem_signaled);

  return 0;
}